

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void on_miss_cb(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  int ret;
  key_t n;
  context *ctx;
  void *arg_local;
  size_t key_size_local;
  void *key_local;
  VMEMcache *cache_local;
  
  iVar1 = vmemcache_put(*(undefined8 *)((long)arg + 8),key,key_size,
                        *(undefined8 *)
                         (*(long *)((long)arg + 0x10) +
                          (*key % (ulong)*(uint *)((long)arg + 0x18)) * 0x10 + 8),
                        *(undefined8 *)
                         (*(long *)((long)arg + 0x10) +
                         (*key % (ulong)*(uint *)((long)arg + 0x18)) * 0x10));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
              ,0x136,"on_miss_cb");
      __stream = _stderr;
      uVar3 = vmemcache_errormsg();
      fprintf(__stream,"ERROR: vmemcache_put: %s",uVar3);
      fprintf(_stderr,"\n");
      abort();
    }
  }
  return;
}

Assistant:

static void
on_miss_cb(VMEMcache *cache, const void *key, size_t key_size, void *arg)
{
	struct context *ctx = arg;

	typedef unsigned long long key_t;
	assert(key_size == sizeof(key_t));

	key_t n = *(key_t *)key;

	int ret = vmemcache_put(ctx->cache, key, key_size,
				ctx->buffs[n % ctx->nbuffs].buff,
				ctx->buffs[n % ctx->nbuffs].size);
	if (ret && errno != EEXIST)
		UT_FATAL("ERROR: vmemcache_put: %s", vmemcache_errormsg());
}